

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

int slang::ast::Constraint::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  uint uVar2;
  ConstraintBlockSyntax *this;
  Constraint *pCVar3;
  ExpressionConstraintSyntax *syntax;
  SolveBeforeConstraintSyntax *syntax_00;
  ImplicationConstraintSyntax *syntax_01;
  LoopConstraintSyntax *syntax_02;
  ConditionalConstraintSyntax *syntax_03;
  DisableConstraintSyntax *syntax_04;
  UniquenessConstraintSyntax *syntax_05;
  logic_error *this_00;
  undefined4 in_register_00000014;
  ASTContext *context;
  undefined4 in_register_0000003c;
  SyntaxNode *this_01;
  allocator<char> local_119;
  ASTContext ctx;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_01 = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  ctx.scope.ptr._0_2_ = __addr->sa_family;
  ctx.scope.ptr._2_1_ = __addr->sa_data[0];
  ctx.scope.ptr._3_1_ = __addr->sa_data[1];
  ctx.scope.ptr._4_4_ = *(undefined4 *)(__addr->sa_data + 2);
  ctx.lookupIndex = *(SymbolIndex *)(__addr->sa_data + 6);
  ctx._12_1_ = __addr->sa_data[10];
  ctx._13_1_ = __addr->sa_data[0xb];
  ctx._14_1_ = __addr->sa_data[0xc];
  ctx._15_1_ = __addr->sa_data[0xd];
  uVar2._0_2_ = __addr[1].sa_family;
  uVar2._2_1_ = __addr[1].sa_data[0];
  uVar2._3_1_ = __addr[1].sa_data[1];
  ctx.flags.m_bits._4_4_ = *(undefined4 *)(__addr[1].sa_data + 2);
  ctx.instanceOrProc._0_4_ = *(undefined4 *)(__addr[1].sa_data + 6);
  ctx.instanceOrProc._4_4_ = *(undefined4 *)(__addr[1].sa_data + 10);
  ctx.firstTempVar._0_2_ = __addr[2].sa_family;
  ctx.firstTempVar._2_1_ = __addr[2].sa_data[0];
  ctx.firstTempVar._3_1_ = __addr[2].sa_data[1];
  ctx.firstTempVar._4_4_ = *(undefined4 *)(__addr[2].sa_data + 2);
  ctx.randomizeDetails._0_4_ = *(undefined4 *)(__addr[2].sa_data + 6);
  ctx.randomizeDetails._4_4_ = *(undefined4 *)(__addr[2].sa_data + 10);
  ctx.assertionInstance = *(AssertionInstanceDetails **)(__addr + 3);
  ctx.flags.m_bits._0_4_ = uVar2 | 0x40;
  SVar1 = this_01->kind;
  if (SVar1 == ConditionalConstraint) {
    syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::ConditionalConstraintSyntax>(this_01);
    pCVar3 = ConditionalConstraint::fromSyntax(syntax_03,&ctx);
  }
  else if (SVar1 == UniquenessConstraint) {
    syntax_05 = slang::syntax::SyntaxNode::as<slang::syntax::UniquenessConstraintSyntax>(this_01);
    pCVar3 = UniquenessConstraint::fromSyntax(syntax_05,&ctx);
  }
  else if (SVar1 == DisableConstraint) {
    syntax_04 = slang::syntax::SyntaxNode::as<slang::syntax::DisableConstraintSyntax>(this_01);
    pCVar3 = DisableSoftConstraint::fromSyntax(syntax_04,&ctx);
  }
  else if (SVar1 == ExpressionConstraint) {
    syntax = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionConstraintSyntax>(this_01);
    pCVar3 = ExpressionConstraint::fromSyntax(syntax,&ctx);
  }
  else if (SVar1 == ImplicationConstraint) {
    syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::ImplicationConstraintSyntax>(this_01);
    pCVar3 = ImplicationConstraint::fromSyntax(syntax_01,&ctx);
  }
  else if (SVar1 == LoopConstraint) {
    syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::LoopConstraintSyntax>(this_01);
    pCVar3 = ForeachConstraint::fromSyntax(syntax_02,&ctx);
  }
  else if (SVar1 == SolveBeforeConstraint) {
    syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::SolveBeforeConstraintSyntax>(this_01);
    pCVar3 = SolveBeforeConstraint::fromSyntax(syntax_00,&ctx);
  }
  else {
    if (SVar1 != ConstraintBlock) {
      this_00 = (logic_error *)
                __cxa_allocate_exception(0x10,__addr,CONCAT44(in_register_00000014,__len));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Constraints.cpp"
                 ,&local_119);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_d8,0x39);
      std::operator+(&local_78,&local_98,&local_d8);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this = slang::syntax::SyntaxNode::as<slang::syntax::ConstraintBlockSyntax>(this_01);
    pCVar3 = ConstraintList::fromSyntax
                       ((ConstraintList *)this,(ConstraintBlockSyntax *)&ctx,context);
  }
  pCVar3->syntax = (ConstraintItemSyntax *)this_01;
  return (int)pCVar3;
}

Assistant:

const Constraint& Constraint::bind(const ConstraintItemSyntax& syntax, const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    Constraint* result;
    switch (syntax.kind) {
        case SyntaxKind::ConstraintBlock:
            result = &ConstraintList::fromSyntax(syntax.as<ConstraintBlockSyntax>(), ctx);
            break;
        case SyntaxKind::ExpressionConstraint:
            result = &ExpressionConstraint::fromSyntax(syntax.as<ExpressionConstraintSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::ImplicationConstraint:
            result = &ImplicationConstraint::fromSyntax(syntax.as<ImplicationConstraintSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::ConditionalConstraint:
            result = &ConditionalConstraint::fromSyntax(syntax.as<ConditionalConstraintSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::UniquenessConstraint:
            result = &UniquenessConstraint::fromSyntax(syntax.as<UniquenessConstraintSyntax>(),
                                                       ctx);
            break;
        case SyntaxKind::DisableConstraint:
            result = &DisableSoftConstraint::fromSyntax(syntax.as<DisableConstraintSyntax>(), ctx);
            break;
        case SyntaxKind::SolveBeforeConstraint:
            result = &SolveBeforeConstraint::fromSyntax(syntax.as<SolveBeforeConstraintSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::LoopConstraint:
            result = &ForeachConstraint::fromSyntax(syntax.as<LoopConstraintSyntax>(), ctx);
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}